

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

CAmount __thiscall CTransaction::GetValueOut(CTransaction *this)

{
  pointer pCVar1;
  ulong uVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (this->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar4 == pCVar1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      if ((2100000000000000 < (ulong)pCVar4->nValue) ||
         (uVar2 = uVar2 + pCVar4->nValue, 2100000000000000 < uVar2)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GetValueOut","");
        pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_70,": value out of range");
        local_50 = (size_type *)(pbVar3->_M_dataplus)._M_p;
        paVar5 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50 == paVar5) {
          local_40 = paVar5->_M_allocated_capacity;
          uStack_38 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_50 = &local_40;
        }
        else {
          local_40 = paVar5->_M_allocated_capacity;
        }
        local_48 = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(this_00,(string *)&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001ea9c7;
      }
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar2;
  }
LAB_001ea9c7:
  __stack_chk_fail();
}

Assistant:

CAmount CTransaction::GetValueOut() const
{
    CAmount nValueOut = 0;
    for (const auto& tx_out : vout) {
        if (!MoneyRange(tx_out.nValue) || !MoneyRange(nValueOut + tx_out.nValue))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
        nValueOut += tx_out.nValue;
    }
    assert(MoneyRange(nValueOut));
    return nValueOut;
}